

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspConfig::Impl::reset(Impl *this)

{
  bool bVar1;
  ConfiguratorProxy *in_RDI;
  
  while( true ) {
    bVar1 = bk_lib::
            pod_vector<Clasp::ClaspConfig::Impl::ConfiguratorProxy,_std::allocator<Clasp::ClaspConfig::Impl::ConfiguratorProxy>_>
            ::empty((pod_vector<Clasp::ClaspConfig::Impl::ConfiguratorProxy,_std::allocator<Clasp::ClaspConfig::Impl::ConfiguratorProxy>_>
                     *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bk_lib::
    pod_vector<Clasp::ClaspConfig::Impl::ConfiguratorProxy,_std::allocator<Clasp::ClaspConfig::Impl::ConfiguratorProxy>_>
    ::back((pod_vector<Clasp::ClaspConfig::Impl::ConfiguratorProxy,_std::allocator<Clasp::ClaspConfig::Impl::ConfiguratorProxy>_>
            *)in_RDI);
    ConfiguratorProxy::destroy(in_RDI);
    bk_lib::
    pod_vector<Clasp::ClaspConfig::Impl::ConfiguratorProxy,_std::allocator<Clasp::ClaspConfig::Impl::ConfiguratorProxy>_>
    ::pop_back((pod_vector<Clasp::ClaspConfig::Impl::ConfiguratorProxy,_std::allocator<Clasp::ClaspConfig::Impl::ConfiguratorProxy>_>
                *)in_RDI);
  }
  return;
}

Assistant:

void ClaspConfig::Impl::reset() {
	for (; !pp.empty(); pp.pop_back()) { pp.back().destroy(); }
}